

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>::alloc
          (array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_> *this
          ,int new_len)

{
  char *pcVar1;
  CCountryFlag *pCVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  CCountryFlag *pCVar7;
  CTextureHandle *pCVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  undefined4 uVar12;
  undefined4 uVar15;
  int iVar16;
  undefined1 auVar14 [16];
  undefined1 auVar17 [16];
  int iVar19;
  undefined1 auVar18 [16];
  undefined1 auVar13 [16];
  
  this->list_size = new_len;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)new_len;
  uVar11 = 0xffffffffffffffff;
  if (SUB168(auVar3 * ZEXT816(0x14),8) == 0) {
    uVar11 = SUB168(auVar3 * ZEXT816(0x14),0);
  }
  pCVar7 = (CCountryFlag *)operator_new__(uVar11);
  auVar6 = _DAT_001d9d10;
  auVar5 = _DAT_001d6f30;
  auVar3 = _DAT_001d6390;
  if (new_len != 0) {
    uVar11 = (long)new_len * 0x14 - 0x14;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar11;
    uVar12 = SUB164(auVar18 * ZEXT816(0xcccccccccccccccd),8);
    uVar15 = (undefined4)(uVar11 / 0x140000000);
    auVar13._0_8_ = CONCAT44(uVar15,uVar12);
    auVar13._8_4_ = uVar12;
    auVar13._12_4_ = uVar15;
    auVar14._0_8_ = auVar13._0_8_ >> 4;
    auVar14._8_8_ = auVar13._8_8_ >> 4;
    pCVar8 = &pCVar7[3].m_Texture;
    uVar9 = 0;
    auVar14 = auVar14 ^ _DAT_001d6390;
    do {
      auVar17._8_4_ = (int)uVar9;
      auVar17._0_8_ = uVar9;
      auVar17._12_4_ = (int)(uVar9 >> 0x20);
      auVar18 = (auVar17 | auVar5) ^ auVar3;
      iVar16 = auVar14._4_4_;
      if ((bool)(~(auVar18._4_4_ == iVar16 && auVar14._0_4_ < auVar18._0_4_ ||
                  iVar16 < auVar18._4_4_) & 1)) {
        pCVar8[-0xf] = -1;
      }
      if ((auVar18._12_4_ != auVar14._12_4_ || auVar18._8_4_ <= auVar14._8_4_) &&
          auVar18._12_4_ <= auVar14._12_4_) {
        pCVar8[-10] = -1;
      }
      auVar18 = (auVar17 | auVar6) ^ auVar3;
      iVar19 = auVar18._4_4_;
      if (iVar19 <= iVar16 && (iVar19 != iVar16 || auVar18._0_4_ <= auVar14._0_4_)) {
        pCVar8[-5] = -1;
        pCVar8->m_Id = -1;
      }
      uVar9 = uVar9 + 4;
      pCVar8 = pCVar8 + 0x14;
    } while ((uVar11 / 0x14 + 4 & 0xfffffffffffffffc) != uVar9);
  }
  if (this->num_elements < new_len) {
    new_len = this->num_elements;
  }
  if (0 < new_len) {
    pCVar2 = this->list;
    lVar10 = 0;
    do {
      *(undefined4 *)(pCVar7->m_aCountryCodeString + lVar10 + 0xc) =
           *(undefined4 *)(pCVar2->m_aCountryCodeString + lVar10 + 0xc);
      pcVar1 = pCVar2->m_aCountryCodeString + lVar10 + -4;
      uVar4 = *(undefined8 *)(pcVar1 + 8);
      *(undefined8 *)(pCVar7->m_aCountryCodeString + lVar10 + -4) = *(undefined8 *)pcVar1;
      *(undefined8 *)(pCVar7->m_aCountryCodeString + lVar10 + -4 + 8) = uVar4;
      lVar10 = lVar10 + 0x14;
    } while ((ulong)(uint)new_len * 0x14 != lVar10);
  }
  if (this->list != (CCountryFlag *)0x0) {
    operator_delete__(this->list);
  }
  iVar16 = this->list_size;
  if (this->num_elements < this->list_size) {
    iVar16 = this->num_elements;
  }
  this->num_elements = iVar16;
  this->list = pCVar7;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}